

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint64_t absl::lts_20240722::hash_internal::HashLen16(uint64_t u,uint64_t v)

{
  ulong uVar1;
  
  uVar1 = (u ^ v) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ v ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

static uint64_t HashLen16(uint64_t u, uint64_t v, uint64_t mul) {
  // Murmur-inspired hashing.
  uint64_t a = (u ^ v) * mul;
  a ^= (a >> 47);
  uint64_t b = (v ^ a) * mul;
  b ^= (b >> 47);
  b *= mul;
  return b;
}